

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

SQInteger __thiscall SQFuncState::CountOuters(SQFuncState *this,SQInteger stacksize)

{
  SQInteger SVar1;
  SQUnsignedInteger SVar2;
  SQUnsignedInteger *pSVar3;
  
  SVar2 = (this->_vlocals)._size;
  pSVar3 = &(this->_vlocals)._vals[SVar2 - 1]._end_op;
  SVar1 = 0;
  while (SVar2 = SVar2 - 1, stacksize <= (long)SVar2) {
    SVar1 = SVar1 + (ulong)(*pSVar3 == 0xffffffffffffffff);
    pSVar3 = pSVar3 + -5;
  }
  return SVar1;
}

Assistant:

SQInteger SQFuncState::CountOuters(SQInteger stacksize)
{
    SQInteger outers = 0;
    SQInteger k = _vlocals.size() - 1;
    while(k >= stacksize) {
        SQLocalVarInfo &lvi = _vlocals[k];
        k--;
        if(lvi._end_op == UINT_MINUS_ONE) { //this means is an outer
            outers++;
        }
    }
    return outers;
}